

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pki.cpp
# Opt level: O0

Url * __thiscall Vault::Pki::getUrl(Url *__return_storage_ptr__,Pki *this,Path *path)

{
  long *plVar1;
  bool local_91;
  string local_90;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_40;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  Path *path_local;
  Pki *this_local;
  
  plVar1 = *(long **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Pki *)__return_storage_ptr__;
  Vault::operator+(&local_40,"/v1/",
                   (Tiny<Vault::SecretMountDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 8));
  local_91 = Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::empty(local_20);
  if (local_91) {
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_60,local_20);
  }
  else {
    Vault::operator+(&local_90,"/",local_20);
    Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Tiny(&local_60,&local_90);
  }
  local_91 = !local_91;
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,&local_40,&local_60);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  if (local_91) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Pki::getUrl(const Path &path) const {
  return client_.getUrl("/v1/" + secretMount_,
                        path.empty() ? path : Path{"/" + path});
}